

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Edge.cc
# Opt level: O3

int __thiscall Edge::binarySearch(Edge *this,pair<int,_int> range,double angle)

{
  iterator *this_00;
  double dVar1;
  int iVar2;
  reference pMVar3;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int range_min;
  uint local_4c;
  double local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  uVar7 = range.first;
  local_48 = angle;
  std::
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::_M_range_check(&this->
                    super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ,(long)(int)uVar7);
  this_00 = &(this->
             super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ).
             super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start;
  pMVar3 = std::
           _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
           ::operator[](this_00,(long)(int)uVar7);
  uVar8 = 0xffffffff;
  if ((pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
      [2] + -1e-07 <= local_48) {
    std::
    deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::_M_range_check(&this->
                      super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ,(long)range >> 0x20);
    pMVar3 = std::
             _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
             ::operator[](this_00,(long)range >> 0x20);
    uVar8 = 0xfffffffe;
    if (local_48 <=
        (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[2] + 1e-07) {
      uVar6 = (ulong)range >> 0x20;
      iVar2 = range.second + uVar7;
      iVar2 = iVar2 - (iVar2 >> 0x1f);
      local_3c = 1;
      local_38 = 1;
      if (1 < (int)uVar7) {
        local_3c = uVar7;
        local_38 = uVar7;
      }
      while( true ) {
        uVar8 = iVar2 >> 1;
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::_M_range_check(&this->
                          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ,(long)(int)uVar8);
        pMVar3 = std::
                 _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                 ::operator[](this_00,(long)(int)uVar8);
        local_4c = range.first;
        if ((int)uVar6 <= (int)local_4c) break;
        dVar1 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[2];
        if (dVar1 + -1e-07 <= local_48) {
          if (local_48 <= dVar1 + 1e-07) {
            puVar5 = &local_34;
            uVar7 = uVar8;
            goto LAB_00107739;
          }
          range.second = 0;
          range.first = uVar8 + 1;
        }
        else {
          uVar6 = (ulong)uVar8;
        }
        iVar2 = (int)uVar6 + range.first;
        iVar2 = iVar2 - (iVar2 >> 0x1f);
      }
      puVar5 = &local_4c;
      uVar7 = local_4c;
LAB_00107739:
      local_34 = uVar8;
      puVar4 = &local_38;
      if ((int)local_3c < (int)uVar7) {
        puVar4 = puVar5;
      }
      uVar8 = *puVar4;
    }
  }
  return uVar8;
}

Assistant:

int Edge::binarySearch(std::pair<int, int> range, double angle) const{
    int s = range.first, e = range.second, m = static_cast<int>((s + e) / 2);
    if (angle < at(s).z() - bs_margin) return -1;
    else if (angle > at(e).z() + bs_margin) return -2;
    int range_min = std::max(1, range.first);
    double mid_angle = at(m).z();
    while (s < e) {
        if (mid_angle - bs_margin > angle) {
            e = m;
        } else if (mid_angle + bs_margin < angle) {
            s = m + 1;
        } else {
            return std::max(range_min, m);
        }
        m = static_cast<int>((s + e) / 2);
        mid_angle = at(m).z();
    } 
    return std::max(range_min, s);
}